

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void vdbePmaWriterInit(sqlite3_file *pFd,PmaWriter *p,int nBuf,i64 iStart)

{
  u8 *puVar1;
  int iVar2;
  long lVar3;
  
  p->iWriteOff = 0;
  p->pFd = (sqlite3_file *)0x0;
  p->nBuffer = 0;
  p->iBufStart = 0;
  *(undefined8 *)&p->iBufEnd = 0;
  *(undefined8 *)p = 0;
  p->aBuffer = (u8 *)0x0;
  puVar1 = (u8 *)sqlite3Malloc((long)nBuf);
  p->aBuffer = puVar1;
  if (puVar1 == (u8 *)0x0) {
    p->eFWErr = 7;
  }
  else {
    lVar3 = iStart % (long)nBuf;
    iVar2 = (int)lVar3;
    p->iBufStart = iVar2;
    p->iBufEnd = iVar2;
    p->iWriteOff = iStart - lVar3;
    p->nBuffer = nBuf;
    p->pFd = pFd;
  }
  return;
}

Assistant:

static void vdbePmaWriterInit(
  sqlite3_file *pFd,              /* File handle to write to */
  PmaWriter *p,                   /* Object to populate */
  int nBuf,                       /* Buffer size */
  i64 iStart                      /* Offset of pFd to begin writing at */
){
  memset(p, 0, sizeof(PmaWriter));
  p->aBuffer = (u8*)sqlite3Malloc(nBuf);
  if( !p->aBuffer ){
    p->eFWErr = SQLITE_NOMEM_BKPT;
  }else{
    p->iBufEnd = p->iBufStart = (iStart % nBuf);
    p->iWriteOff = iStart - p->iBufStart;
    p->nBuffer = nBuf;
    p->pFd = pFd;
  }
}